

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O2

int SetAllPWMsSSC32(SSC32 *pSSC32,int *selectedchannels,int *pws)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  byte bVar9;
  int pws_tmp [32];
  char sendbuf [512];
  char szTmp [512];
  
  bVar9 = 0;
  memset(szTmp,0,0x200);
  memset(sendbuf,0,0x200);
  piVar8 = pws_tmp;
  for (lVar7 = 0x20; lVar7 != 0; lVar7 = lVar7 + -1) {
    *piVar8 = *pws;
    pws = pws + (ulong)bVar9 * -2 + 1;
    piVar8 = piVar8 + (ulong)bVar9 * -2 + 1;
  }
  for (lVar7 = -0x20; lVar7 != 0; lVar7 = lVar7 + 1) {
    if (selectedchannels[lVar7 + 0x20] != 0) {
      iVar1 = (int)((double)(*(int *)(sendbuf + lVar7 * 4) + -0x5dc) *
                   *(double *)(pSSC32->bProportionalPWs + lVar7 * 2));
      if (pSSC32->bProportionalPWs[lVar7 + 0x20] == 0) {
        uVar2 = iVar1 + 0x5dc;
      }
      else {
        iVar6 = pSSC32->MaxPWs[lVar7];
        if (iVar1 < 0) {
          iVar4 = pSSC32->MidPWs[lVar7] - iVar6;
          iVar5 = -500;
        }
        else {
          iVar4 = pSSC32->InitPWs[lVar7] - iVar6;
          iVar5 = 500;
        }
        uVar2 = (iVar4 * iVar1) / iVar5 + iVar6;
      }
      if (pSSC32->InitPWs[lVar7] <= (int)uVar2) {
        uVar2 = pSSC32->InitPWs[lVar7];
      }
      if ((int)uVar2 <= pSSC32->MidPWs[lVar7]) {
        uVar2 = pSSC32->MidPWs[lVar7];
      }
      *(uint *)(sendbuf + lVar7 * 4) = uVar2;
      iVar6 = uVar2 - *(int *)(pSSC32->szCfgFilePath + lVar7 * 4);
      iVar1 = -iVar6;
      if (0 < iVar6) {
        iVar1 = iVar6;
      }
      if (pSSC32->ThresholdPWs[lVar7 + 0x20] <= iVar1) {
        sprintf(szTmp,"#%dP%d",(ulong)((int)lVar7 + 0x20),(ulong)uVar2);
        strcat(sendbuf,szTmp);
      }
    }
  }
  if (sendbuf[0] == '\0') {
    iVar1 = 0;
  }
  else {
    sVar3 = strlen(sendbuf);
    (sendbuf + sVar3)[0] = '\r';
    (sendbuf + sVar3)[1] = '\0';
    sVar3 = strlen(sendbuf);
    iVar1 = WriteDataSSC32(pSSC32,(uint8 *)sendbuf,(int)sVar3,pSSC32->bytedelayus);
    if (iVar1 == 0) {
      if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(sendbuf,(long)(int)sVar3,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      iVar1 = 0;
      for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
        if (selectedchannels[lVar7] != 0) {
          iVar4 = pws_tmp[lVar7] - pSSC32->LastPWs[lVar7];
          iVar6 = -iVar4;
          if (0 < iVar4) {
            iVar6 = iVar4;
          }
          if (pSSC32->ThresholdPWs[lVar7] <= iVar6) {
            pSSC32->LastPWs[lVar7] = pws_tmp[lVar7];
          }
        }
      }
    }
    else {
      puts("Error writing data to a SSC32. ");
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

inline int SetAllPWMsSSC32(SSC32* pSSC32, int* selectedchannels, int* pws)
{
	char szTmp[MAX_NB_BYTES_SSC32];
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_SSC32];

	memset(szTmp, 0, sizeof(szTmp));

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_SSC32; channel++)
	{
		if (!selectedchannels[channel]) continue;

		if (pSSC32->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pSSC32->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_SSC32));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pSSC32->MidPWs[channel]+pws_tmp[channel]*(pSSC32->MaxPWs[channel]-pSSC32->MidPWs[channel])
				/(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32);
			else
				pws_tmp[channel] = pSSC32->MidPWs[channel]+pws_tmp[channel]*(pSSC32->MinPWs[channel]-pSSC32->MidPWs[channel])
				/(DEFAULT_MIN_PW_SSC32-DEFAULT_MID_PW_SSC32);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_SSC32+(int)(pSSC32->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_SSC32));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pSSC32->MaxPWs[channel]), pSSC32->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_SSC32), DEFAULT_ABSOLUTE_MIN_PW_SSC32);

		// The requested PWM is only applied if it is slightly different from the current value.
		if (abs(pws_tmp[channel]-pSSC32->LastPWs[channel]) < pSSC32->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pSSC32->LastPWs[channel], abs(pws_tmp[channel]-pSSC32->LastPWs[channel]), pSSC32->ThresholdPWs[channel]);

		sprintf(szTmp, "#%dP%d", channel, pws_tmp[channel]);
		strcat(sendbuf, szTmp);
	}

	if (sendbuf[0] == 0) return EXIT_SUCCESS;

	strcat(sendbuf, "\r");
	sendbuflen = (int)strlen(sendbuf);

	//printf("%s\n", sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_SSC32; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pSSC32->LastPWs[channel]) < pSSC32->ThresholdPWs[channel]) continue;

		// Update last known value.
		pSSC32->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}